

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

bool isJitEnabled(void)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  int enableJit;
  bool ok;
  QByteArray jitEnvironment;
  bool local_2d;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  byte bVar4;
  QByteArray *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QByteArray *)0xaaaaaaaaaaaaaaaa;
  qgetenv((char *)CONCAT17(in_stack_ffffffffffffffdf,
                           CONCAT16(in_stack_ffffffffffffffde,
                                    CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))))
  ;
  bVar2 = QByteArray::isEmpty((QByteArray *)0x143671);
  if (bVar2) {
    local_2d = true;
  }
  else {
    bVar4 = 0;
    iVar3 = QByteArray::toInt(this,(bool *)CONCAT17(0xaa,CONCAT16(in_stack_ffffffffffffffde,
                                                                  CONCAT24(in_stack_ffffffffffffffdc
                                                                           ,
                                                  in_stack_ffffffffffffffd8))),
                              in_stack_ffffffffffffffd4);
    local_2d = (bVar4 & 1) == 0 || iVar3 != 0;
  }
  QByteArray::~QByteArray((QByteArray *)0x1436da);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(local_2d & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool isJitEnabled()
{
    QByteArray jitEnvironment = qgetenv("QT_ENABLE_REGEXP_JIT");
    if (!jitEnvironment.isEmpty()) {
        bool ok;
        int enableJit = jitEnvironment.toInt(&ok);
        return ok ? (enableJit != 0) : true;
    }

#ifdef QT_DEBUG
    return false;
#elif defined(Q_OS_MACOS) && !defined(QT_BOOTSTRAPPED)
    return !qt_mac_runningUnderRosetta();
#else
    return true;
#endif
}